

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::Block::performLocalNameSearch
          (Block *this,NameSearch *search,Statement *statementToSearchUpTo)

{
  size_t sVar1;
  pointer ppVar2;
  string *psVar3;
  ASTObject *pAVar4;
  pool_ref<soul::AST::Statement> *s;
  pointer ppVar5;
  ASTObject *o;
  
  if (search->findVariables == true) {
    sVar1 = (search->partiallyQualifiedPath).pathSections.numActive;
    if (sVar1 == 0) {
      throwInternalCompilerError("! empty()","back",0xaa);
    }
    ppVar5 = (this->statements).
             super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->statements).
             super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar5 == ppVar2) {
      o = (ASTObject *)0x0;
    }
    else {
      psVar3 = (search->partiallyQualifiedPath).pathSections.items[sVar1 - 1].name;
      o = (ASTObject *)0x0;
      do {
        if (ppVar5->object == statementToSearchUpTo) break;
        if (ppVar5->object == (Statement *)0x0) {
          pAVar4 = (ASTObject *)0x0;
        }
        else {
          pAVar4 = (ASTObject *)
                   __dynamic_cast(ppVar5->object,&Statement::typeinfo,&VariableDeclaration::typeinfo
                                  ,0);
        }
        if ((pAVar4 != (ASTObject *)0x0) && ((string *)pAVar4[1]._vptr_ASTObject == psVar3)) {
          o = pAVar4;
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != ppVar2);
    }
    if (o != (ASTObject *)0x0) {
      Scope::NameSearch::addResult(search,o);
      return;
    }
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* statementToSearchUpTo) const override
        {
            if (search.findVariables)
            {
                auto name = search.partiallyQualifiedPath.getLastPart();
                pool_ptr<VariableDeclaration> lastMatch;

                for (auto& s : statements)
                {
                    if (s.getPointer() == statementToSearchUpTo)
                        break;

                    if (auto v = cast<VariableDeclaration> (s))
                        if (v->name == name)
                            lastMatch = v;
                }

                if (lastMatch != nullptr)
                    search.addResult (*lastMatch);
            }
        }